

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::OneofDescriptorProto::Serialize(OneofDescriptorProto *this,Message *msg)

{
  bool bVar1;
  OneofOptions *this_00;
  Message *msg_00;
  void *data;
  size_t size;
  Message *msg_local;
  OneofDescriptorProto *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendString(msg,1,&this->name_);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::OneofOptions>::operator*
                        (&this->options_);
    msg_00 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,2);
    OneofOptions::Serialize(this_00,msg_00);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void OneofDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 2: options
  if (_has_field_[2]) {
    (*options_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}